

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswDyn.c
# Opt level: O3

int Ssw_ManSweepResimulateDynLocal(Ssw_Man_t *p,int f)

{
  uint uVar1;
  Aig_Man_t *pAVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  int iVar5;
  void **ppvVar6;
  Vec_Ptr_t *pVVar7;
  Aig_Obj_t **ppAVar8;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  Aig_Obj_t *pAVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int nSize;
  timespec ts;
  int local_54;
  int *local_50;
  long local_48;
  timespec local_40;
  
  iVar4 = clock_gettime(3,&local_40);
  if (iVar4 < 0) {
    local_48 = 1;
  }
  else {
    lVar10 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_40.tv_nsec),8);
    local_48 = ((lVar10 >> 7) - (lVar10 >> 0x3f)) + local_40.tv_sec * -1000000;
  }
  p->nSimRounds = p->nSimRounds + 1;
  Ssw_ManSweepTransferDyn(p);
  p->vResimConsts->nSize = 0;
  p->vResimClasses->nSize = 0;
  Aig_ManIncrementTravId(p->pAig);
  uVar15 = p->iNodeStart;
  uVar13 = (ulong)uVar15;
  if ((int)uVar15 < p->pPars->nResimDelta + p->iNodeLast) {
    do {
      pAVar2 = p->pAig;
      if (pAVar2->vObjs->nSize <= (int)uVar13) break;
      if ((int)uVar15 < 0) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar11 = (Aig_Obj_t *)pAVar2->vObjs->pArray[uVar13];
      if (pAVar11 != (Aig_Obj_t *)0x0) {
        if (pAVar2->pReprs == (Aig_Obj_t **)0x0) {
          if (pAVar2->pConst1 == (Aig_Obj_t *)0x0) goto LAB_006ac859;
        }
        else {
          pAVar3 = pAVar2->pReprs[pAVar11->Id];
          if (pAVar3 == pAVar2->pConst1) {
LAB_006ac859:
            pVVar9 = p->vResimConsts;
            piVar12 = &pVVar9->nSize;
            uVar1 = pVVar9->nSize;
            if (uVar1 == pVVar9->nCap) {
              if ((int)uVar1 < 0x10) {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar9->pArray,0x80);
                }
                pVVar9->pArray = ppvVar6;
                pVVar9->nCap = 0x10;
              }
              else {
                local_50 = piVar12;
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar9->pArray,(ulong)uVar1 << 4);
                }
                pVVar9->pArray = ppvVar6;
                pVVar9->nCap = uVar1 * 2;
                piVar12 = local_50;
              }
            }
            else {
              ppvVar6 = pVVar9->pArray;
            }
          }
          else {
            if ((pAVar3 == (Aig_Obj_t *)0x0) || (pAVar3->TravId == pAVar2->nTravIds))
            goto LAB_006ac944;
            pAVar3->TravId = pAVar2->nTravIds;
            pVVar9 = p->vResimClasses;
            piVar12 = &pVVar9->nSize;
            uVar1 = pVVar9->nSize;
            pAVar11 = pAVar3;
            if (uVar1 == pVVar9->nCap) {
              if ((int)uVar1 < 0x10) {
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc(0x80);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar9->pArray,0x80);
                }
                pVVar9->pArray = ppvVar6;
                pVVar9->nCap = 0x10;
              }
              else {
                local_50 = piVar12;
                if (pVVar9->pArray == (void **)0x0) {
                  ppvVar6 = (void **)malloc((ulong)uVar1 << 4);
                }
                else {
                  ppvVar6 = (void **)realloc(pVVar9->pArray,(ulong)uVar1 << 4);
                }
                pVVar9->pArray = ppvVar6;
                pVVar9->nCap = uVar1 * 2;
                piVar12 = local_50;
              }
            }
            else {
              ppvVar6 = pVVar9->pArray;
            }
          }
          iVar4 = *piVar12;
          *piVar12 = iVar4 + 1;
          ppvVar6[iVar4] = pAVar11;
        }
      }
LAB_006ac944:
      uVar13 = uVar13 + 1;
    } while ((int)uVar13 < p->pPars->nResimDelta + p->iNodeLast);
  }
  p->nVisCounter = p->nVisCounter + 1;
  pVVar9 = p->vResimConsts;
  if (0 < pVVar9->nSize) {
    lVar10 = 0;
    do {
      Ssw_SmlSimulateOneDyn_rec
                (p->pSml,(Aig_Obj_t *)pVVar9->pArray[lVar10],p->nFrames + -1,p->pVisited,
                 p->nVisCounter);
      lVar10 = lVar10 + 1;
      pVVar9 = p->vResimConsts;
    } while (lVar10 < pVVar9->nSize);
  }
  pVVar7 = p->vResimClasses;
  if (0 < pVVar7->nSize) {
    lVar10 = 0;
    do {
      ppAVar8 = Ssw_ClassesReadClass(p->ppClasses,(Aig_Obj_t *)pVVar7->pArray[lVar10],&local_54);
      if (0 < local_54) {
        lVar14 = 0;
        do {
          Ssw_SmlSimulateOneDyn_rec
                    (p->pSml,ppAVar8[lVar14],p->nFrames + -1,p->pVisited,p->nVisCounter);
          lVar14 = lVar14 + 1;
        } while (lVar14 < local_54);
      }
      lVar10 = lVar10 + 1;
      pVVar7 = p->vResimClasses;
    } while (lVar10 < pVVar7->nSize);
    pVVar9 = p->vResimConsts;
  }
  iVar4 = Ssw_ClassesRefineConst1Group(p->ppClasses,pVVar9,1);
  pVVar9 = p->vResimClasses;
  uVar15 = 0;
  if (0 < pVVar9->nSize) {
    lVar10 = 0;
    do {
      iVar5 = Ssw_ClassesRefineOneClass(p->ppClasses,(Aig_Obj_t *)pVVar9->pArray[lVar10],1);
      uVar15 = uVar15 + iVar5;
      lVar10 = lVar10 + 1;
      pVVar9 = p->vResimClasses;
    } while (lVar10 < pVVar9->nSize);
    uVar15 = (uint)(0 < (int)uVar15);
  }
  pVVar9 = p->vSimInfo;
  if (0 < pVVar9->nSize) {
    lVar10 = 0;
    do {
      *(undefined4 *)pVVar9->pArray[lVar10] = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 < pVVar9->nSize);
  }
  p->nPatterns = 0;
  p->nSimRounds = p->nSimRounds + 1;
  iVar5 = clock_gettime(3,&local_40);
  if (iVar5 < 0) {
    lVar10 = -1;
  }
  else {
    lVar10 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
  }
  p->timeSimSat = p->timeSimSat + lVar10 + local_48;
  return (uint)(byte)(0 < iVar4 | (byte)uVar15);
}

Assistant:

int Ssw_ManSweepResimulateDynLocal( Ssw_Man_t * p, int f )
{
    Aig_Obj_t * pObj, * pRepr, ** ppClass;
    int i, k, nSize, RetValue1, RetValue2;
    abctime clk = Abc_Clock();
    p->nSimRounds++;
    // transfer PI simulation information from storage
//    Ssw_SmlAssignDist1Plus( p->pSml, p->pPatWords );
    Ssw_ManSweepTransferDyn( p );
    // determine const1 cands and classes to be simulated
    Vec_PtrClear( p->vResimConsts );
    Vec_PtrClear( p->vResimClasses );
    Aig_ManIncrementTravId( p->pAig );
    for ( i = p->iNodeStart; i < p->iNodeLast + p->pPars->nResimDelta; i++ )
    {
        if ( i >= Aig_ManObjNumMax( p->pAig ) )
            break;
        pObj = Aig_ManObj( p->pAig, i );
        if ( pObj == NULL )
            continue;
        if ( Ssw_ObjIsConst1Cand(p->pAig, pObj) )
        {
            Vec_PtrPush( p->vResimConsts, pObj );
            continue;
        }
        pRepr = Aig_ObjRepr(p->pAig, pObj);
        if ( pRepr == NULL )
            continue;
        if ( Aig_ObjIsTravIdCurrent(p->pAig, pRepr) )
            continue;
        Aig_ObjSetTravIdCurrent(p->pAig, pRepr);
        Vec_PtrPush( p->vResimClasses, pRepr );
    }
    // simulate internal nodes
//    Ssw_SmlSimulateOneFrame( p->pSml );
//    Ssw_SmlSimulateOne( p->pSml );
    // resimulate dynamically
//    Aig_ManIncrementTravId( p->pAig );
//    Aig_ObjIsTravIdCurrent( p->pAig, Aig_ManConst1(p->pAig) );
    p->nVisCounter++;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimConsts, pObj, i )
        Ssw_SmlSimulateOneDyn_rec( p->pSml, pObj, p->nFrames-1, p->pVisited, p->nVisCounter );
    // resimulate the cone of influence of the cand classes
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimClasses, pRepr, i )
    {
        ppClass = Ssw_ClassesReadClass( p->ppClasses, pRepr, &nSize );
        for ( k = 0; k < nSize; k++ )
            Ssw_SmlSimulateOneDyn_rec( p->pSml, ppClass[k], p->nFrames-1, p->pVisited, p->nVisCounter );
    }

    // check equivalence classes
//    RetValue1 = Ssw_ClassesRefineConst1( p->ppClasses, 1 );
//    RetValue2 = Ssw_ClassesRefine( p->ppClasses, 1 );
    // refine these nodes
    RetValue1 = Ssw_ClassesRefineConst1Group( p->ppClasses, p->vResimConsts, 1 );
    RetValue2 = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vResimClasses, pRepr, i )
        RetValue2 += Ssw_ClassesRefineOneClass( p->ppClasses, pRepr, 1 );

    // prepare simulation info for the next round
    Vec_PtrCleanSimInfo( p->vSimInfo, 0, 1 );
    p->nPatterns = 0;
    p->nSimRounds++;
p->timeSimSat += Abc_Clock() - clk;
    return RetValue1 > 0 || RetValue2 > 0;
}